

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statements.cpp
# Opt level: O0

void __thiscall hsql::TableRef::~TableRef(TableRef *this)

{
  TableRef *this_local;
  
  ~TableRef(this);
  operator_delete(this);
  return;
}

Assistant:

TableRef::~TableRef() {
    free(schema);
    free(name);
    free(alias);

    delete select;
    delete join;

    if (list != NULL) {
      for (TableRef* table : *list) {
        delete table;
      }
      delete list;
    }
  }